

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeApplyAffinity(Parse *pParse,int base,int n,char *zAff)

{
  char *in_RCX;
  int in_EDX;
  long in_RDI;
  Vdbe *v;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  uint3 uVar1;
  uint in_stack_ffffffffffffffdc;
  char *local_18;
  uint op;
  
  local_18 = in_RCX;
  if (in_RCX != (char *)0x0) {
    while( true ) {
      op = in_stack_ffffffffffffffdc & 0xffffff;
      if (0 < in_EDX) {
        op = CONCAT13(*local_18 == 'A',(int3)in_stack_ffffffffffffffdc);
      }
      if ((char)(op >> 0x18) == '\0') break;
      in_EDX = in_EDX + -1;
      local_18 = local_18 + 1;
      in_stack_ffffffffffffffdc = op;
    }
    while( true ) {
      uVar1 = (uint3)(ushort)op;
      if (1 < in_EDX) {
        uVar1 = CONCAT12(local_18[in_EDX + -1] == 'A',(ushort)op);
      }
      op = CONCAT13((char)(op >> 0x18),uVar1);
      if ((char)(uVar1 >> 0x10) == '\0') break;
      in_EDX = in_EDX + -1;
    }
    if (0 < in_EDX) {
      sqlite3VdbeAddOp4(*(Vdbe **)(in_RDI + 0x10),op,in_stack_ffffffffffffffd8,
                        in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                        (char *)CONCAT44(in_stack_ffffffffffffffcc,in_EDX),in_EDX);
    }
  }
  return;
}

Assistant:

static void codeApplyAffinity(Parse *pParse, int base, int n, char *zAff){
  Vdbe *v = pParse->pVdbe;
  if( zAff==0 ){
    assert( pParse->db->mallocFailed );
    return;
  }
  assert( v!=0 );

  /* Adjust base and n to skip over SQLITE_AFF_BLOB entries at the beginning
  ** and end of the affinity string.
  */
  while( n>0 && zAff[0]==SQLITE_AFF_BLOB ){
    n--;
    base++;
    zAff++;
  }
  while( n>1 && zAff[n-1]==SQLITE_AFF_BLOB ){
    n--;
  }

  /* Code the OP_Affinity opcode if there is anything left to do. */
  if( n>0 ){
    sqlite3VdbeAddOp4(v, OP_Affinity, base, n, 0, zAff, n);
  }
}